

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O0

Node * __thiscall
mapbox::detail::Earcut<unsigned_int>::filterPoints(Earcut<unsigned_int> *this,Node *start,Node *end)

{
  bool bVar1;
  bool bVar2;
  double dVar3;
  Node *pNStack_28;
  bool again;
  Node *p;
  Node *end_local;
  Node *start_local;
  Earcut<unsigned_int> *this_local;
  
  pNStack_28 = start;
  p = end;
  if (end == (Node *)0x0) {
    p = start;
  }
  do {
    bVar1 = false;
    if ((pNStack_28->steiner & 1U) == 0) {
      bVar2 = equals(this,pNStack_28,pNStack_28->next);
      if (!bVar2) {
        dVar3 = area(this,pNStack_28->prev,pNStack_28,pNStack_28->next);
        if ((dVar3 != 0.0) || (NAN(dVar3))) goto LAB_00580305;
      }
      removeNode(this,pNStack_28);
      pNStack_28 = pNStack_28->prev;
      if (pNStack_28 == pNStack_28->next) {
        return pNStack_28;
      }
      bVar1 = true;
      p = pNStack_28;
    }
    else {
LAB_00580305:
      pNStack_28 = pNStack_28->next;
    }
    if (!bVar1 && pNStack_28 == p) {
      return p;
    }
  } while( true );
}

Assistant:

typename Earcut<N>::Node*
Earcut<N>::filterPoints(Node* start, Node* end) {
    if (!end) end = start;

    Node* p = start;
    bool again;
    do {
        again = false;

        if (!p->steiner && (equals(p, p->next) || area(p->prev, p, p->next) == 0)) {
            removeNode(p);
            p = end = p->prev;

            if (p == p->next) break;
            again = true;

        } else {
            p = p->next;
        }
    } while (again || p != end);

    return end;
}